

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)138,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  Dn dn;
  byte bVar10;
  uint uVar11;
  uint local_34;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  if (((short)uVar4 < 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)138,(moira::Mode)0,4>(this,str,addr,op);
    return;
  }
  uVar9 = uVar4 & 0xffff;
  uVar11 = uVar9 >> 6;
  local_34 = uVar11 & 0x1f;
  s = &str->ptr;
  cVar8 = 'b';
  lVar6 = 1;
  do {
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = cVar8;
    cVar8 = "bfffo"[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(op & 7));
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar5 = uVar4 & 0x820;
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ',';
    if (uVar5 < 0x800) {
      if (uVar5 != 0) {
        sprintd_signed(s,(ulong)local_34);
LAB_00361398:
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ',';
        StrWriter::operator<<(str,(Dn)(uVar4 & 7));
        goto LAB_00361417;
      }
      sprintd_signed(s,(ulong)local_34);
      pcVar7 = *s;
      *s = pcVar7 + 1;
    }
    else {
      if (uVar5 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar11 & 7));
        goto LAB_00361398;
      }
      StrWriter::operator<<(str,(Dn)(uVar11 & 7));
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
    }
    *pcVar7 = ',';
    sprintd_signed(s,(ulong)(uVar4 & 0x1f));
    goto LAB_00361417;
  }
  bVar10 = 0x20;
  if ((uVar4 & 0x1f) != 0) {
    bVar10 = (byte)uVar9 & 0x1f;
  }
  uVar4 = uVar4 & 0x820;
  if (uVar4 < 0x800) {
    if (uVar4 != 0) {
      cVar8 = ' ';
      lVar6 = 0;
      do {
        pcVar7 = *s;
        *s = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = " {"[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
      sprintd_signed(s,(ulong)local_34);
LAB_003613e9:
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar10 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_00361408;
    }
    cVar8 = ' ';
    lVar6 = 0;
    do {
      pcVar7 = *s;
      *s = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = " {"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    sprintd_signed(s,(ulong)local_34);
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ':';
    sprintd_signed(s,(ulong)bVar10);
    pcVar7 = *s;
    *s = pcVar7 + 1;
  }
  else {
    if (uVar4 != 0x800) {
      cVar8 = ' ';
      lVar6 = 0;
      do {
        pcVar7 = *s;
        *s = pcVar7 + 1;
        *pcVar7 = cVar8;
        cVar8 = " {"[lVar6 + 1];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 2);
      StrWriter::operator<<(str,(Dn)(uVar11 & 7));
      goto LAB_003613e9;
    }
    cVar8 = ' ';
    lVar6 = 0;
    do {
      pcVar7 = *s;
      *s = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = " {"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 2);
    StrWriter::operator<<(str,(Dn)(uVar11 & 7));
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ':';
    sprintd_signed(s,(ulong)bVar10);
LAB_00361408:
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
  }
  *pcVar7 = '}';
LAB_00361417:
  pcVar7 = str->ptr;
  str->ptr = pcVar7 + 1;
  *pcVar7 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar7 = *s;
    *s = pcVar7 + 1;
    *pcVar7 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(uVar9 >> 0xc & 7));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar8 = ';';
    lVar6 = 1;
    do {
      pcVar7 = *s;
      *s = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "trap%-2s  ; (2+)"[lVar6 + 10];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}